

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_smpl.c
# Opt level: O1

int ec_GFp_simple_point_set_affine_coordinates
              (EC_GROUP *group,EC_POINT *point,BIGNUM *x,BIGNUM *y,BN_CTX *ctx)

{
  int iVar1;
  BIGNUM *z;
  
  if (y == (BIGNUM *)0x0 || x == (BIGNUM *)0x0) {
    return 0;
  }
  z = BN_value_one();
  iVar1 = EC_POINT_set_Jprojective_coordinates_GFp
                    ((EC_GROUP *)group,(EC_POINT *)point,(BIGNUM *)x,(BIGNUM *)y,z,(BN_CTX *)ctx);
  return iVar1;
}

Assistant:

int ec_GFp_simple_point_set_affine_coordinates(const EC_GROUP *group,
                                               EC_POINT *point,
                                               const BIGNUM *x,
                                               const BIGNUM *y, BN_CTX *ctx)
{
    if (x == NULL || y == NULL) {
        /*
         * unlike for projective coordinates, we do not tolerate this
         */
        // //ECerr(EC_F_EC_GFP_SIMPLE_POINT_SET_AFFINE_COORDINATES,
        //       ERR_R_PASSED_NULL_PARAMETER);
        return 0;
    }

    return EC_POINT_set_Jprojective_coordinates_GFp(group, point, x, y,
                                                    BN_value_one(), ctx);
}